

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O2

void __thiscall TPZFront<double>::TPZFront(TPZFront<double> *this,void **vtt,int64_t GlobalSize)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  TPZManVector<long,_10>::TPZManVector(&this->fGlobal,0);
  (this->fLocal)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fLocal).fStore = (long *)0x0;
  (this->fLocal).fNElements = 0;
  (this->fLocal).fNAlloc = 0;
  TPZStack<int,_10>::TPZStack(&this->fFree);
  (this->fData)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649128;
  (this->fData).fStore = (double *)0x0;
  (this->fData).fNElements = 0;
  (this->fData).fNAlloc = 0;
  this->fExpandRatio = 200;
  this->fFront = 0;
  this->fMaxFront = 0;
  TPZVec<long>::Resize(&this->fLocal,GlobalSize);
  plVar1 = (this->fLocal).fStore;
  lVar2 = 0;
  lVar3 = 0;
  if (0 < GlobalSize) {
    lVar3 = GlobalSize;
  }
  for (; lVar3 != lVar2; lVar2 = lVar2 + 1) {
    plVar1[lVar2] = -1;
  }
  this->fWork = 0;
  this->fNextRigidBodyMode = GlobalSize;
  this->fProductMTData = (STensorProductMTData *)0x0;
  this->fDecomposeType = ELU;
  return;
}

Assistant:

TPZFront<TVar>::TPZFront(int64_t GlobalSize)
{
	fExpandRatio = 200;
	fFront = 0;
	fMaxFront=0;
	fLocal.Resize(GlobalSize);
	int64_t i;
	for(i=0;i<GlobalSize;i++) fLocal[i]=-1;
	fWork = 0;
	fNextRigidBodyMode = GlobalSize;
	fProductMTData = NULL;
    fDecomposeType = ELU;
}